

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::simplifyDual(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp,bool *again)

{
  int *piVar1;
  shared_ptr<soplex::Tolerances> *psVar2;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  uint *puVar3;
  int iVar4;
  int p_size;
  int iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  undefined8 uVar9;
  type_conflict5 tVar10;
  bool bVar11;
  bool bVar12;
  int t;
  int iVar13;
  double *pdVar14;
  undefined8 *puVar15;
  FreeConstraintPS *this_01;
  ulong uVar16;
  Item *pIVar17;
  pointer pnVar18;
  FixBoundsPS *pFVar19;
  SPxOut *pSVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  int j;
  long lVar24;
  cpp_dec_float<50U,_int,_void> *v;
  ulong uVar25;
  long lVar26;
  int j_00;
  Result RVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bound;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  uint local_6e8;
  uint uStack_6e4;
  uint uStack_6e0;
  uint uStack_6dc;
  uint local_6d8;
  undefined3 uStack_6d3;
  int local_6d0;
  bool local_6cc;
  fpclass_type local_6c8;
  int32_t iStack_6c4;
  int local_694;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualConsUp;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualConsLo;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualVarUp;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualVarLo;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_618;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_608;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_5f8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_548;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_508;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_488;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  DataArray<bool> colSingleton;
  cpp_dec_float<50U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  iVar4 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  p_size = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  DataArray<bool>::DataArray(&colSingleton,p_size,0,1.2);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&dualVarLo,
               (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&dualVarUp,
               (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&dualConsLo,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&dualConsUp,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  uVar22 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  psVar2 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  this_00 = &this->m_hist;
  t = 0;
  local_694 = 0;
  uVar21 = uVar22;
  while (uVar22 = uVar22 - 1, 0 < (int)uVar21) {
    pnVar18 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar14 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)&ptr,-*pdVar14,(type *)0x0);
    tVar10 = boost::multiprecision::operator<=
                       (pnVar18 + uVar22,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&ptr);
    if (tVar10) {
      pnVar18 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&bound.m_backend,*pdVar14,(type *)0x0);
      tVar10 = boost::multiprecision::operator>=
                         (pnVar18 + uVar22,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&bound.m_backend);
      if (!tVar10) goto LAB_0026630e;
      this_01 = (FreeConstraintPS *)operator_new(0x88);
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_5d8,
                 &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      FreeConstraintPS::FreeConstraintPS
                (this_01,lp,uVar21 - 1,(shared_ptr<soplex::Tolerances> *)&local_5d8);
      std::
      __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
      ::
      __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS,void>
                ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                  *)&ptr,this_01);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5d8._M_refcount);
      std::
      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
      ::push_back(&this_00->data,(value_type *)&ptr);
      iVar13 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem
               [(lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[uVar22].idx].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused;
      removeRow(this,lp,uVar21 - 1);
      local_694 = local_694 + 1;
      t = t + iVar13;
      piVar1 = (this->m_stat).data + 1;
      *piVar1 = *piVar1 + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      uVar21 = uVar22;
    }
    else {
LAB_0026630e:
      pnVar18 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&bound.m_backend,-*pdVar14,(type *)0x0);
      tVar10 = boost::multiprecision::operator<=
                         (pnVar18 + uVar22,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&bound.m_backend);
      if (tVar10) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&ptr,0.0,(type *)0x0);
      }
      else {
        pdVar14 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&ptr,-*pdVar14,(type *)0x0);
      }
      *(ulong *)(dualVarLo.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems + 8) =
           CONCAT35(uStack_6d3,_local_6d8);
      puVar3 = dualVarLo.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems + 4;
      *puVar3 = local_6e8;
      puVar3[1] = uStack_6e4;
      puVar3[2] = uStack_6e0;
      puVar3[3] = uStack_6dc;
      pnVar18 = dualVarLo.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar22;
      (pnVar18->m_backend).data._M_elems[0] =
           (uint)ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      (pnVar18->m_backend).data._M_elems[1] =
           ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr._4_4_;
      (pnVar18->m_backend).data._M_elems[2] =
           (uint)ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
      (pnVar18->m_backend).data._M_elems[3] =
           ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._4_4_;
      dualVarLo.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.exp = local_6d0;
      dualVarLo.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.neg = local_6cc;
      dualVarLo.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.fpclass = local_6c8;
      dualVarLo.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.prec_elem = iStack_6c4;
      pnVar18 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&bound.m_backend,*pdVar14,(type *)0x0);
      tVar10 = boost::multiprecision::operator>=
                         (pnVar18 + uVar22,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&bound.m_backend);
      uVar28 = 0;
      uVar29 = 0;
      if (!tVar10) {
        puVar15 = (undefined8 *)infinity();
        uVar28 = (undefined4)*puVar15;
        uVar29 = (undefined4)((ulong)*puVar15 >> 0x20);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,(double)CONCAT44(uVar29,uVar28),(type *)0x0);
      *(ulong *)(dualVarUp.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems + 8) =
           CONCAT35(uStack_6d3,_local_6d8);
      puVar3 = dualVarUp.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar3 = _local_6e8;
      *(ulong *)(puVar3 + 2) = CONCAT44(uStack_6dc,uStack_6e0);
      pnVar18 = dualVarUp.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar22;
      (pnVar18->m_backend).data._M_elems[0] =
           (uint)ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      (pnVar18->m_backend).data._M_elems[1] =
           ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr._4_4_;
      (pnVar18->m_backend).data._M_elems[2] =
           (uint)ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
      (pnVar18->m_backend).data._M_elems[3] =
           ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._4_4_;
      dualVarUp.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.exp = local_6d0;
      dualVarUp.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.neg = local_6cc;
      dualVarUp.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.fpclass = local_6c8;
      dualVarUp.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar22].m_backend.prec_elem = iStack_6c4;
      uVar21 = uVar21 - 1;
    }
  }
  lVar23 = 0;
  for (lVar24 = 0;
      uVar16 = (ulong)(lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum, lVar24 < (long)uVar16; lVar24 = lVar24 + 1) {
    pIVar17 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem;
    iVar13 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[lVar24].idx;
    if (pIVar17[iVar13].data.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused == 1) {
      pNVar8 = pIVar17[iVar13].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar13 = pNVar8->idx;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = *(element_type **)&(pNVar8->val).m_backend.data;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((pNVar8->val).m_backend.data._M_elems + 2);
      bound.m_backend.fpclass = cpp_dec_float_finite;
      bound.m_backend.prec_elem = 10;
      bound.m_backend.data._M_elems[0] = 0;
      bound.m_backend.data._M_elems[1] = 0;
      bound.m_backend.data._M_elems[2] = 0;
      bound.m_backend.data._M_elems[3] = 0;
      bound.m_backend.data._M_elems[4] = 0;
      bound.m_backend.data._M_elems[5] = 0;
      bound.m_backend.data._M_elems._24_5_ = 0;
      bound.m_backend.data._M_elems[7]._1_3_ = 0;
      bound.m_backend.data._M_elems._32_5_ = 0;
      bound.m_backend.data._M_elems[9]._1_3_ = 0;
      bound.m_backend.exp = 0;
      bound.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&bound.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)(((lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).object.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar23),(cpp_dec_float<50U,_int,_void> *)&ptr);
      local_1b8.data._M_elems[0] = 0;
      tVar10 = boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&ptr,(int *)&local_1b8);
      if (tVar10) {
        pnVar18 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar14 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_1b8,-*pdVar14,(type *)0x0);
        tVar10 = boost::multiprecision::operator<=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)(pnVar18->m_backend).data._M_elems + lVar23),
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1b8);
        if (tVar10) {
          tVar10 = boost::multiprecision::operator<
                             (&bound,dualVarUp.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + iVar13);
          if (tVar10) {
            *(ulong *)(dualVarUp.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems + 8
                      ) = CONCAT35(bound.m_backend.data._M_elems[9]._1_3_,
                                   bound.m_backend.data._M_elems._32_5_);
            puVar3 = dualVarUp.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = bound.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar3 + 2) =
                 CONCAT35(bound.m_backend.data._M_elems[7]._1_3_,
                          bound.m_backend.data._M_elems._24_5_);
            *(undefined8 *)
             dualVarUp.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems =
                 bound.m_backend.data._M_elems._0_8_;
            *(undefined8 *)
             (dualVarUp.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems + 2) =
                 bound.m_backend.data._M_elems._8_8_;
            dualVarUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.exp = bound.m_backend.exp;
            dualVarUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.neg = bound.m_backend.neg;
            dualVarUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.fpclass =
                 bound.m_backend.fpclass;
            dualVarUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.prec_elem =
                 bound.m_backend.prec_elem;
          }
        }
        pnVar18 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar14 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_1b8,*pdVar14,(type *)0x0);
        tVar10 = boost::multiprecision::operator>=
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)(pnVar18->m_backend).data._M_elems + lVar23),
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_1b8);
        if (tVar10) {
          tVar10 = boost::multiprecision::operator>
                             (&bound,dualVarLo.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + iVar13);
          if (tVar10) {
            *(ulong *)(dualVarLo.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems + 8
                      ) = CONCAT35(bound.m_backend.data._M_elems[9]._1_3_,
                                   bound.m_backend.data._M_elems._32_5_);
            puVar3 = dualVarLo.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = bound.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar3 + 2) =
                 CONCAT35(bound.m_backend.data._M_elems[7]._1_3_,
                          bound.m_backend.data._M_elems._24_5_);
            pnVar18 = dualVarLo.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar13;
            (pnVar18->m_backend).data._M_elems[0] = bound.m_backend.data._M_elems[0];
            (pnVar18->m_backend).data._M_elems[1] = bound.m_backend.data._M_elems[1];
            (pnVar18->m_backend).data._M_elems[2] = bound.m_backend.data._M_elems[2];
            (pnVar18->m_backend).data._M_elems[3] = bound.m_backend.data._M_elems[3];
            dualVarLo.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.exp = bound.m_backend.exp;
            dualVarLo.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.neg = bound.m_backend.neg;
            dualVarLo.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.fpclass =
                 bound.m_backend.fpclass;
            dualVarLo.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.prec_elem =
                 bound.m_backend.prec_elem;
          }
        }
      }
      else {
        local_1b8.data._M_elems[0] = 0;
        tVar10 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&ptr,(int *)&local_1b8);
        if (tVar10) {
          pnVar18 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar14 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_1b8,-*pdVar14,(type *)0x0);
          tVar10 = boost::multiprecision::operator<=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)(pnVar18->m_backend).data._M_elems + lVar23),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1b8);
          if (tVar10) {
            tVar10 = boost::multiprecision::operator>
                               (&bound,dualVarLo.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + iVar13);
            if (tVar10) {
              *(ulong *)(dualVarLo.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems +
                        8) = CONCAT35(bound.m_backend.data._M_elems[9]._1_3_,
                                      bound.m_backend.data._M_elems._32_5_);
              puVar3 = dualVarLo.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems + 4
              ;
              *(undefined8 *)puVar3 = bound.m_backend.data._M_elems._16_8_;
              *(ulong *)(puVar3 + 2) =
                   CONCAT35(bound.m_backend.data._M_elems[7]._1_3_,
                            bound.m_backend.data._M_elems._24_5_);
              *(undefined8 *)
               dualVarLo.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems =
                   bound.m_backend.data._M_elems._0_8_;
              *(undefined8 *)
               (dualVarLo.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems + 2) =
                   bound.m_backend.data._M_elems._8_8_;
              dualVarLo.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.exp = bound.m_backend.exp;
              dualVarLo.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.neg = bound.m_backend.neg;
              dualVarLo.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.fpclass =
                   bound.m_backend.fpclass;
              dualVarLo.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.prec_elem =
                   bound.m_backend.prec_elem;
            }
          }
          pnVar18 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar14 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_1b8,*pdVar14,(type *)0x0);
          tVar10 = boost::multiprecision::operator>=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)(pnVar18->m_backend).data._M_elems + lVar23),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_1b8);
          if ((tVar10) &&
             (tVar10 = boost::multiprecision::operator<
                                 (&bound,dualVarUp.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + iVar13), tVar10
             )) {
            *(ulong *)(dualVarUp.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems + 8
                      ) = CONCAT35(bound.m_backend.data._M_elems[9]._1_3_,
                                   bound.m_backend.data._M_elems._32_5_);
            puVar3 = dualVarUp.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = bound.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar3 + 2) =
                 CONCAT35(bound.m_backend.data._M_elems[7]._1_3_,
                          bound.m_backend.data._M_elems._24_5_);
            pnVar18 = dualVarUp.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar13;
            (pnVar18->m_backend).data._M_elems[0] = bound.m_backend.data._M_elems[0];
            (pnVar18->m_backend).data._M_elems[1] = bound.m_backend.data._M_elems[1];
            (pnVar18->m_backend).data._M_elems[2] = bound.m_backend.data._M_elems[2];
            (pnVar18->m_backend).data._M_elems[3] = bound.m_backend.data._M_elems[3];
            dualVarUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.exp = bound.m_backend.exp;
            dualVarUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.neg = bound.m_backend.neg;
            dualVarUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.fpclass =
                 bound.m_backend.fpclass;
            dualVarUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend.prec_elem =
                 bound.m_backend.prec_elem;
          }
        }
      }
    }
    lVar23 = lVar23 + 0x38;
  }
  for (lVar23 = 0; lVar23 < (int)uVar16; lVar23 = lVar23 + 1) {
    v = &dualConsUp.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)v,0.0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&dualConsLo.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend,v);
    pIVar17 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar23].idx;
    lVar26 = 0;
    for (lVar24 = 0;
        pnVar18 = dualConsLo.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar24 < (pIVar17->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused; lVar24 = lVar24 + 1) {
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,-*pdVar14,(type *)0x0);
      tVar10 = boost::multiprecision::operator<=
                         (pnVar18 + lVar23,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&ptr);
      pnVar18 = dualConsUp.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (tVar10) {
        pdVar14 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&bound.m_backend,*pdVar14,(type *)0x0);
        tVar10 = boost::multiprecision::operator>=
                           (pnVar18 + lVar23,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&bound.m_backend);
        if (tVar10) break;
      }
      puVar15 = (undefined8 *)
                ((long)(((pIVar17->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem)->val).m_backend.data._M_elems + lVar26);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)*puVar15;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar15[1];
      iVar13 = *(int *)((long)(&((pIVar17->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem)->val + 1) + lVar26);
      bound.m_backend.data._M_elems._0_8_ = bound.m_backend.data._M_elems._0_8_ & 0xffffffff00000000
      ;
      tVar10 = boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&ptr,(int *)&bound.m_backend);
      pnVar18 = dualVarLo.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (tVar10) {
        pdVar14 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&bound.m_backend,-*pdVar14,(type *)0x0);
        tVar10 = boost::multiprecision::operator<=
                           (pnVar18 + iVar13,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&bound.m_backend);
        if (tVar10) {
          pdVar14 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&bound.m_backend,-*pdVar14,(type *)0x0);
          *(ulong *)(dualConsLo.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.data._M_elems + 8)
               = CONCAT35(bound.m_backend.data._M_elems[9]._1_3_,
                          bound.m_backend.data._M_elems._32_5_);
          puVar3 = dualConsLo.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar3 = bound.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar3 + 2) =
               CONCAT35(bound.m_backend.data._M_elems[7]._1_3_,bound.m_backend.data._M_elems._24_5_)
          ;
          pnVar18 = dualConsLo.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar23;
          (pnVar18->m_backend).data._M_elems[0] = bound.m_backend.data._M_elems[0];
          (pnVar18->m_backend).data._M_elems[1] = bound.m_backend.data._M_elems[1];
          (pnVar18->m_backend).data._M_elems[2] = bound.m_backend.data._M_elems[2];
          (pnVar18->m_backend).data._M_elems[3] = bound.m_backend.data._M_elems[3];
          dualConsLo.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.exp = bound.m_backend.exp;
          dualConsLo.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.neg = bound.m_backend.neg;
          dualConsLo.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.fpclass =
               bound.m_backend.fpclass;
          dualConsLo.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.prec_elem =
               bound.m_backend.prec_elem;
        }
        else {
          bound.m_backend.fpclass = cpp_dec_float_finite;
          bound.m_backend.prec_elem = 10;
          bound.m_backend.data._M_elems[0] = 0;
          bound.m_backend.data._M_elems[1] = 0;
          bound.m_backend.data._M_elems[2] = 0;
          bound.m_backend.data._M_elems[3] = 0;
          bound.m_backend.data._M_elems[4] = 0;
          bound.m_backend.data._M_elems[5] = 0;
          bound.m_backend.data._M_elems._24_5_ = 0;
          bound.m_backend.data._M_elems[7]._1_3_ = 0;
          bound.m_backend.data._M_elems._32_5_ = 0;
          bound.m_backend.data._M_elems[9]._1_3_ = 0;
          bound.m_backend.exp = 0;
          bound.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&bound.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr,
                     &dualVarLo.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&dualConsLo.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend,&bound.m_backend);
        }
        pnVar18 = dualVarUp.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar14 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&bound.m_backend,*pdVar14,(type *)0x0);
        tVar10 = boost::multiprecision::operator>=
                           (pnVar18 + iVar13,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&bound.m_backend);
        if (tVar10) {
          pdVar14 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&bound.m_backend,*pdVar14,(type *)0x0);
          pnVar18 = dualConsUp.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_00266ceb:
          *(ulong *)(pnVar18[lVar23].m_backend.data._M_elems + 8) =
               CONCAT35(bound.m_backend.data._M_elems[9]._1_3_,bound.m_backend.data._M_elems._32_5_)
          ;
          puVar3 = pnVar18[lVar23].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar3 = bound.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar3 + 2) =
               CONCAT35(bound.m_backend.data._M_elems[7]._1_3_,bound.m_backend.data._M_elems._24_5_)
          ;
          *(undefined8 *)pnVar18[lVar23].m_backend.data._M_elems =
               bound.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(pnVar18[lVar23].m_backend.data._M_elems + 2) =
               bound.m_backend.data._M_elems._8_8_;
          pnVar18[lVar23].m_backend.exp = bound.m_backend.exp;
          pnVar18[lVar23].m_backend.neg = bound.m_backend.neg;
          pnVar18[lVar23].m_backend.fpclass = bound.m_backend.fpclass;
          pnVar18[lVar23].m_backend.prec_elem = bound.m_backend.prec_elem;
        }
        else {
          bound.m_backend.fpclass = cpp_dec_float_finite;
          bound.m_backend.prec_elem = 10;
          bound.m_backend.data._M_elems[0] = 0;
          bound.m_backend.data._M_elems[1] = 0;
          bound.m_backend.data._M_elems[2] = 0;
          bound.m_backend.data._M_elems[3] = 0;
          bound.m_backend.data._M_elems[4] = 0;
          bound.m_backend.data._M_elems[5] = 0;
          bound.m_backend.data._M_elems._24_5_ = 0;
          bound.m_backend.data._M_elems[7]._1_3_ = 0;
          bound.m_backend.data._M_elems._32_5_ = 0;
          bound.m_backend.data._M_elems[9]._1_3_ = 0;
          bound.m_backend.exp = 0;
          bound.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&bound.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr,
                     &dualVarUp.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&dualConsUp.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend,&bound.m_backend);
        }
      }
      else {
        bound.m_backend.data._M_elems._0_8_ =
             bound.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar10 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&ptr,(int *)&bound.m_backend);
        pnVar18 = dualVarLo.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (tVar10) {
          pdVar14 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&bound.m_backend,-*pdVar14,(type *)0x0);
          tVar10 = boost::multiprecision::operator<=
                             (pnVar18 + iVar13,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&bound.m_backend);
          if (tVar10) {
            pdVar14 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&bound.m_backend,*pdVar14,(type *)0x0);
            *(ulong *)(dualConsUp.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.data._M_elems + 8
                      ) = CONCAT35(bound.m_backend.data._M_elems[9]._1_3_,
                                   bound.m_backend.data._M_elems._32_5_);
            puVar3 = dualConsUp.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar3 = bound.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar3 + 2) =
                 CONCAT35(bound.m_backend.data._M_elems[7]._1_3_,
                          bound.m_backend.data._M_elems._24_5_);
            pnVar18 = dualConsUp.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar23;
            (pnVar18->m_backend).data._M_elems[0] = bound.m_backend.data._M_elems[0];
            (pnVar18->m_backend).data._M_elems[1] = bound.m_backend.data._M_elems[1];
            (pnVar18->m_backend).data._M_elems[2] = bound.m_backend.data._M_elems[2];
            (pnVar18->m_backend).data._M_elems[3] = bound.m_backend.data._M_elems[3];
            dualConsUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.exp = bound.m_backend.exp;
            dualConsUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.neg = bound.m_backend.neg;
            dualConsUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.fpclass =
                 bound.m_backend.fpclass;
            dualConsUp.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend.prec_elem =
                 bound.m_backend.prec_elem;
          }
          else {
            bound.m_backend.fpclass = cpp_dec_float_finite;
            bound.m_backend.prec_elem = 10;
            bound.m_backend.data._M_elems[0] = 0;
            bound.m_backend.data._M_elems[1] = 0;
            bound.m_backend.data._M_elems[2] = 0;
            bound.m_backend.data._M_elems[3] = 0;
            bound.m_backend.data._M_elems[4] = 0;
            bound.m_backend.data._M_elems[5] = 0;
            bound.m_backend.data._M_elems._24_5_ = 0;
            bound.m_backend.data._M_elems[7]._1_3_ = 0;
            bound.m_backend.data._M_elems._32_5_ = 0;
            bound.m_backend.data._M_elems[9]._1_3_ = 0;
            bound.m_backend.exp = 0;
            bound.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&bound.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr,
                       &dualVarLo.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&dualConsUp.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend,&bound.m_backend
                      );
          }
          pnVar18 = dualVarUp.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar14 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&bound.m_backend,*pdVar14,(type *)0x0);
          tVar10 = boost::multiprecision::operator>=
                             (pnVar18 + iVar13,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&bound.m_backend);
          if (tVar10) {
            pdVar14 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&bound.m_backend,-*pdVar14,(type *)0x0);
            pnVar18 = dualConsLo.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_00266ceb;
          }
          bound.m_backend.fpclass = cpp_dec_float_finite;
          bound.m_backend.prec_elem = 10;
          bound.m_backend.data._M_elems[0] = 0;
          bound.m_backend.data._M_elems[1] = 0;
          bound.m_backend.data._M_elems[2] = 0;
          bound.m_backend.data._M_elems[3] = 0;
          bound.m_backend.data._M_elems[4] = 0;
          bound.m_backend.data._M_elems[5] = 0;
          bound.m_backend.data._M_elems._24_5_ = 0;
          bound.m_backend.data._M_elems[7]._1_3_ = 0;
          bound.m_backend.data._M_elems._32_5_ = 0;
          bound.m_backend.data._M_elems[9]._1_3_ = 0;
          bound.m_backend.exp = 0;
          bound.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&bound.m_backend,(cpp_dec_float<50U,_int,_void> *)&ptr,
                     &dualVarUp.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar13].m_backend);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&dualConsLo.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend,&bound.m_backend);
        }
      }
      lVar26 = lVar26 + 0x3c;
    }
    uVar16 = (ulong)(uint)(lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum;
  }
  uVar16 = uVar16 & 0xffffffff;
  iVar13 = 0;
  while( true ) {
    do {
      if ((int)uVar16 < 1) {
        uVar22 = iVar13 + local_694;
        RVar27 = OKAY;
        if (uVar22 != 0 && SCARRY4(iVar13,local_694) == (int)uVar22 < 0) {
          piVar1 = &(this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_remRows;
          *piVar1 = *piVar1 + local_694;
          piVar1 = &(this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_remCols;
          *piVar1 = *piVar1 + iVar13;
          piVar1 = &(this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_remNzos;
          *piVar1 = *piVar1 + t;
          pSVar20 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          if ((pSVar20 != (SPxOut *)0x0) && (3 < (int)pSVar20->m_verbosity)) {
            ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)
                      CONCAT44(ptr.
                               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._4_4_,pSVar20->m_verbosity);
            bound.m_backend.data._M_elems[0] = 4;
            (*pSVar20->_vptr_SPxOut[2])();
            pSVar20 = soplex::operator<<((this->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).spxout,"Simplifier (dual) removed ");
            pSVar20 = soplex::operator<<(pSVar20,local_694);
            pSVar20 = soplex::operator<<(pSVar20," rows, ");
            pSVar20 = soplex::operator<<(pSVar20,iVar13);
            pSVar20 = soplex::operator<<(pSVar20," cols, ");
            pSVar20 = soplex::operator<<(pSVar20,t);
            pSVar20 = soplex::operator<<(pSVar20," non-zeros");
            std::endl<char,std::char_traits<char>>(pSVar20->m_streams[pSVar20->m_verbosity]);
            pSVar20 = (this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            (*pSVar20->_vptr_SPxOut[2])(pSVar20,&ptr);
          }
          bound.m_backend.data._M_elems._0_8_ = (long)p_size + (long)iVar4;
          ptr.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          ptr.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1b8.data._M_elems[0] = uVar22;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                    ((cpp_dec_float<50U,_int,_void> *)&ptr,
                     &(this->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_minReduction.m_backend,(longlong *)&bound);
          tVar10 = boost::multiprecision::operator>
                             ((int *)&local_1b8,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&ptr);
          RVar27 = OKAY;
          if (tVar10) {
            *again = true;
          }
        }
        goto LAB_002679f7;
      }
      uVar16 = uVar16 - 1;
      j_00 = (int)uVar16;
      uVar25 = uVar16 & 0xffffffff;
    } while ((lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem
             [(lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[uVar25].idx].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused < 2);
    local_208.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)
          dualConsUp.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems;
    local_208.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)
          (dualConsUp.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 2);
    puVar3 = dualConsUp.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 4;
    local_208.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
    local_208.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
    local_208.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)
          (dualConsUp.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 8);
    local_208.m_backend.exp =
         dualConsUp.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.exp;
    local_208.m_backend.neg =
         dualConsUp.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.neg;
    local_208.m_backend.fpclass =
         dualConsUp.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.fpclass;
    local_208.m_backend.prec_elem =
         dualConsUp.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.prec_elem;
    local_248.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)
          (dualConsLo.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 8);
    local_248.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)
          dualConsLo.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems;
    local_248.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)
          (dualConsLo.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 2);
    puVar3 = dualConsLo.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 4;
    local_248.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
    local_248.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
    local_248.m_backend.exp =
         dualConsLo.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.exp;
    local_248.m_backend.neg =
         dualConsLo.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.neg;
    local_248.m_backend.fpclass =
         dualConsLo.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.fpclass;
    local_248.m_backend.prec_elem =
         dualConsLo.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.prec_elem;
    opttol(&local_68,this);
    bVar11 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_208,&local_248,&local_68);
    if (bVar11) break;
    pnVar18 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 8);
    bound.m_backend.data._M_elems._32_5_ = SUB85(uVar9,0);
    bound.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
    bound.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar18[uVar25].m_backend.data;
    bound.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 2);
    puVar3 = pnVar18[uVar25].m_backend.data._M_elems + 4;
    bound.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
    uVar9 = *(undefined8 *)(puVar3 + 2);
    bound.m_backend.data._M_elems._24_5_ = SUB85(uVar9,0);
    bound.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
    iVar5 = pnVar18[uVar25].m_backend.exp;
    bVar11 = pnVar18[uVar25].m_backend.neg;
    fVar6 = pnVar18[uVar25].m_backend.fpclass;
    iVar7 = pnVar18[uVar25].m_backend.prec_elem;
    local_508.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar18[uVar25].m_backend.data;
    local_508.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 2);
    puVar3 = pnVar18[uVar25].m_backend.data._M_elems + 4;
    local_508.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
    local_508.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
    local_508.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 8);
    local_288.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)
          dualConsUp.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems;
    local_288.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)
          (dualConsUp.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 2);
    puVar3 = dualConsUp.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 4;
    local_288.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
    local_288.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
    local_288.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)
          (dualConsUp.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 8);
    local_288.m_backend.exp =
         dualConsUp.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.exp;
    local_288.m_backend.neg =
         dualConsUp.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.neg;
    local_288.m_backend.fpclass =
         dualConsUp.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.fpclass;
    local_288.m_backend.prec_elem =
         dualConsUp.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.prec_elem;
    local_508.m_backend.exp = iVar5;
    local_508.m_backend.neg = bVar11;
    local_508.m_backend.fpclass = fVar6;
    local_508.m_backend.prec_elem = iVar7;
    opttol(&local_a0,this);
    bVar12 = GTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_508,&local_288,&local_a0);
    if (bVar12) {
      pnVar18 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,*pdVar14,(type *)0x0);
      tVar10 = boost::multiprecision::operator>=
                         (pnVar18 + uVar25,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&ptr);
      if (tVar10) {
        pSVar20 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar20 != (SPxOut *)0x0) && (3 < (int)pSVar20->m_verbosity)) {
          ptr.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)
                    CONCAT44(ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._4_4_,pSVar20->m_verbosity);
          local_1b8.data._M_elems[0] = 4;
          (*pSVar20->_vptr_SPxOut[2])();
          pSVar20 = soplex::operator<<((this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout," unbounded");
          std::endl<char,std::char_traits<char>>(pSVar20->m_streams[pSVar20->m_verbosity]);
          pSVar20 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar20->_vptr_SPxOut[2])(pSVar20,&ptr);
        }
LAB_00267b20:
        RVar27 = UNBOUNDED;
LAB_002679f7:
        std::
        _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         *)&dualConsUp);
        std::
        _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         *)&dualConsLo);
        std::
        _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         *)&dualVarUp);
        std::
        _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         *)&dualVarLo);
        DataArray<bool>::~DataArray(&colSingleton);
        return RVar27;
      }
      pnVar18 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar19 = (FixBoundsPS *)operator_new(0x30);
      local_2c8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 8);
      local_2c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar18[uVar25].m_backend.data;
      local_2c8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 2);
      puVar3 = pnVar18[uVar25].m_backend.data._M_elems + 4;
      local_2c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_2c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      local_2c8.m_backend.exp = pnVar18[uVar25].m_backend.exp;
      local_2c8.m_backend.neg = pnVar18[uVar25].m_backend.neg;
      local_2c8.m_backend.fpclass = pnVar18[uVar25].m_backend.fpclass;
      local_2c8.m_backend.prec_elem = pnVar18[uVar25].m_backend.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_5e8,
                 &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      FixBoundsPS::FixBoundsPS
                (pFVar19,lp,j_00,&local_2c8,(shared_ptr<soplex::Tolerances> *)&local_5e8);
      std::
      __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
      ::
      __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                  *)&ptr,pFVar19);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5e8._M_refcount);
      std::
      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
      ::push_back(&this_00->data,(value_type *)&ptr);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2a])
                (lp,uVar16 & 0xffffffff,
                 (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar25,0);
LAB_002672fc:
      piVar1 = (this->m_stat).data + 10;
      *piVar1 = *piVar1 + 1;
LAB_0026730b:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      local_548.m_backend.data._M_elems[9]._1_3_ = bound.m_backend.data._M_elems[9]._1_3_;
      local_548.m_backend.data._M_elems._32_5_ = bound.m_backend.data._M_elems._32_5_;
      local_548.m_backend.data._M_elems[7]._1_3_ = bound.m_backend.data._M_elems[7]._1_3_;
      local_548.m_backend.data._M_elems._24_5_ = bound.m_backend.data._M_elems._24_5_;
      local_548.m_backend.data._M_elems[4] = bound.m_backend.data._M_elems[4];
      local_548.m_backend.data._M_elems[5] = bound.m_backend.data._M_elems[5];
      local_548.m_backend.data._M_elems[0] = bound.m_backend.data._M_elems[0];
      local_548.m_backend.data._M_elems[1] = bound.m_backend.data._M_elems[1];
      local_548.m_backend.data._M_elems[2] = bound.m_backend.data._M_elems[2];
      local_548.m_backend.data._M_elems[3] = bound.m_backend.data._M_elems[3];
      local_308.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)
            dualConsLo.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems;
      local_308.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)
            (dualConsLo.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 2);
      puVar3 = dualConsLo.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 4;
      local_308.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_308.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      local_308.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)
            (dualConsLo.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 8);
      local_308.m_backend.exp =
           dualConsLo.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.exp;
      local_308.m_backend.neg =
           dualConsLo.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.neg;
      local_308.m_backend.fpclass =
           dualConsLo.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.fpclass;
      local_308.m_backend.prec_elem =
           dualConsLo.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.prec_elem;
      local_548.m_backend.exp = iVar5;
      local_548.m_backend.neg = bVar11;
      local_548.m_backend.fpclass = fVar6;
      local_548.m_backend.prec_elem = iVar7;
      opttol(&local_d8,this);
      bVar12 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_548,&local_308,&local_d8);
      if (bVar12) {
        pnVar18 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar14 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&ptr,-*pdVar14,(type *)0x0);
        tVar10 = boost::multiprecision::operator<=
                           (pnVar18 + uVar25,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&ptr);
        if (!tVar10) {
          pnVar18 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pFVar19 = (FixBoundsPS *)operator_new(0x30);
          local_348.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 8);
          local_348.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar18[uVar25].m_backend.data;
          local_348.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 2);
          puVar3 = pnVar18[uVar25].m_backend.data._M_elems + 4;
          local_348.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
          local_348.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
          local_348.m_backend.exp = pnVar18[uVar25].m_backend.exp;
          local_348.m_backend.neg = pnVar18[uVar25].m_backend.neg;
          local_348.m_backend.fpclass = pnVar18[uVar25].m_backend.fpclass;
          local_348.m_backend.prec_elem = pnVar18[uVar25].m_backend.prec_elem;
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_5f8,
                     &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
          FixBoundsPS::FixBoundsPS
                    (pFVar19,lp,j_00,&local_348,(shared_ptr<soplex::Tolerances> *)&local_5f8);
          std::
          __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
          ::
          __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                    ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                      *)&ptr,pFVar19);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5f8._M_refcount);
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
          ::push_back(&this_00->data,(value_type *)&ptr);
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x2d])
                    (lp,uVar16 & 0xffffffff,
                     (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar25,0);
          goto LAB_002672fc;
        }
        pSVar20 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar20 != (SPxOut *)0x0) && (3 < (int)pSVar20->m_verbosity)) {
          ptr.
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)
                    CONCAT44(ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr._4_4_,pSVar20->m_verbosity);
          local_1b8.data._M_elems[0] = 4;
          (*pSVar20->_vptr_SPxOut[2])();
          pSVar20 = soplex::operator<<((this->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout," unbounded");
          std::endl<char,std::char_traits<char>>(pSVar20->m_streams[pSVar20->m_verbosity]);
          pSVar20 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar20->_vptr_SPxOut[2])(pSVar20,&ptr);
        }
        goto LAB_00267b20;
      }
      pnVar18 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,*pdVar14,(type *)0x0);
      tVar10 = boost::multiprecision::operator<
                         (pnVar18 + uVar25,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&ptr);
      if (tVar10) {
        local_588.m_backend.data._M_elems[9]._1_3_ = bound.m_backend.data._M_elems[9]._1_3_;
        local_588.m_backend.data._M_elems._32_5_ = bound.m_backend.data._M_elems._32_5_;
        local_588.m_backend.data._M_elems[7]._1_3_ = bound.m_backend.data._M_elems[7]._1_3_;
        local_588.m_backend.data._M_elems._24_5_ = bound.m_backend.data._M_elems._24_5_;
        local_588.m_backend.data._M_elems[4] = bound.m_backend.data._M_elems[4];
        local_588.m_backend.data._M_elems[5] = bound.m_backend.data._M_elems[5];
        local_588.m_backend.data._M_elems[0] = bound.m_backend.data._M_elems[0];
        local_588.m_backend.data._M_elems[1] = bound.m_backend.data._M_elems[1];
        local_588.m_backend.data._M_elems[2] = bound.m_backend.data._M_elems[2];
        local_588.m_backend.data._M_elems[3] = bound.m_backend.data._M_elems[3];
        local_388.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)
              dualConsUp.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems;
        local_388.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)
              (dualConsUp.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 2);
        puVar3 = dualConsUp.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 4;
        local_388.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        local_388.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
        local_388.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)
              (dualConsUp.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 8);
        local_388.m_backend.exp =
             dualConsUp.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.exp;
        local_388.m_backend.neg =
             dualConsUp.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.neg;
        local_388.m_backend.fpclass =
             dualConsUp.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.fpclass;
        local_388.m_backend.prec_elem =
             dualConsUp.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.prec_elem;
        local_588.m_backend.exp = iVar5;
        local_588.m_backend.neg = bVar11;
        local_588.m_backend.fpclass = fVar6;
        local_588.m_backend.prec_elem = iVar7;
        opttol(&local_110,this);
        bVar12 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_588,&local_388,&local_110);
        if (!bVar12) goto LAB_00267680;
        pFVar19 = (FixBoundsPS *)operator_new(0x30);
        pnVar18 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_3c8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 8);
        local_3c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar18[uVar25].m_backend.data;
        local_3c8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 2);
        puVar3 = pnVar18[uVar25].m_backend.data._M_elems + 4;
        local_3c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        local_3c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
        local_3c8.m_backend.exp = pnVar18[uVar25].m_backend.exp;
        local_3c8.m_backend.neg = pnVar18[uVar25].m_backend.neg;
        local_3c8.m_backend.fpclass = pnVar18[uVar25].m_backend.fpclass;
        local_3c8.m_backend.prec_elem = pnVar18[uVar25].m_backend.prec_elem;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_608,
                   &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        FixBoundsPS::FixBoundsPS
                  (pFVar19,lp,j_00,&local_3c8,(shared_ptr<soplex::Tolerances> *)&local_608);
        std::
        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
        ::
        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                  ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                    *)&ptr,pFVar19);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_608._M_refcount);
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&this_00->data,&ptr);
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2a])
                  (lp,uVar16 & 0xffffffff,
                   (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar25,0);
LAB_00267884:
        piVar1 = (this->m_stat).data + 0xb;
        *piVar1 = *piVar1 + 1;
        goto LAB_0026730b;
      }
LAB_00267680:
      pnVar18 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&ptr,-*pdVar14,(type *)0x0);
      tVar10 = boost::multiprecision::operator>
                         (pnVar18 + uVar25,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&ptr);
      if (tVar10) {
        local_5c8.m_backend.data._M_elems[9]._1_3_ = bound.m_backend.data._M_elems[9]._1_3_;
        local_5c8.m_backend.data._M_elems._32_5_ = bound.m_backend.data._M_elems._32_5_;
        local_5c8.m_backend.data._M_elems[7]._1_3_ = bound.m_backend.data._M_elems[7]._1_3_;
        local_5c8.m_backend.data._M_elems._24_5_ = bound.m_backend.data._M_elems._24_5_;
        local_5c8.m_backend.data._M_elems[4] = bound.m_backend.data._M_elems[4];
        local_5c8.m_backend.data._M_elems[5] = bound.m_backend.data._M_elems[5];
        local_5c8.m_backend.data._M_elems[0] = bound.m_backend.data._M_elems[0];
        local_5c8.m_backend.data._M_elems[1] = bound.m_backend.data._M_elems[1];
        local_5c8.m_backend.data._M_elems[2] = bound.m_backend.data._M_elems[2];
        local_5c8.m_backend.data._M_elems[3] = bound.m_backend.data._M_elems[3];
        local_408.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)
              dualConsLo.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems;
        local_408.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)
              (dualConsLo.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 2);
        puVar3 = dualConsLo.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 4;
        local_408.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        local_408.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
        local_408.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)
              (dualConsLo.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.data._M_elems + 8);
        local_408.m_backend.exp =
             dualConsLo.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.exp;
        local_408.m_backend.neg =
             dualConsLo.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.neg;
        local_408.m_backend.fpclass =
             dualConsLo.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.fpclass;
        local_408.m_backend.prec_elem =
             dualConsLo.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar25].m_backend.prec_elem;
        local_5c8.m_backend.exp = iVar5;
        local_5c8.m_backend.neg = bVar11;
        local_5c8.m_backend.fpclass = fVar6;
        local_5c8.m_backend.prec_elem = iVar7;
        opttol(&local_148,this);
        bVar11 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_5c8,&local_408,&local_148);
        if (bVar11) {
          pFVar19 = (FixBoundsPS *)operator_new(0x30);
          pnVar18 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_448.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 8);
          local_448.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar18[uVar25].m_backend.data;
          local_448.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 2);
          puVar3 = pnVar18[uVar25].m_backend.data._M_elems + 4;
          local_448.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
          local_448.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
          local_448.m_backend.exp = pnVar18[uVar25].m_backend.exp;
          local_448.m_backend.neg = pnVar18[uVar25].m_backend.neg;
          local_448.m_backend.fpclass = pnVar18[uVar25].m_backend.fpclass;
          local_448.m_backend.prec_elem = pnVar18[uVar25].m_backend.prec_elem;
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_618,
                     &psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
          FixBoundsPS::FixBoundsPS
                    (pFVar19,lp,j_00,&local_448,(shared_ptr<soplex::Tolerances> *)&local_618);
          std::
          __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
          ::
          __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                    ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                      *)&ptr,pFVar19);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_618._M_refcount);
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
          ::push_back(&this_00->data,&ptr);
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x2d])
                    (lp,uVar16 & 0xffffffff,
                     (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar25,0);
          goto LAB_00267884;
        }
      }
    }
    pnVar18 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_488.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 8);
    local_488.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar18[uVar25].m_backend.data;
    local_488.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 2);
    puVar3 = pnVar18[uVar25].m_backend.data._M_elems + 4;
    local_488.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
    local_488.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
    local_488.m_backend.exp = pnVar18[uVar25].m_backend.exp;
    local_488.m_backend.neg = pnVar18[uVar25].m_backend.neg;
    local_488.m_backend.fpclass = pnVar18[uVar25].m_backend.fpclass;
    local_488.m_backend.prec_elem = pnVar18[uVar25].m_backend.prec_elem;
    pnVar18 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).up.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_4c8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 8);
    local_4c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar18[uVar25].m_backend.data;
    local_4c8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar18[uVar25].m_backend.data._M_elems + 2);
    puVar3 = pnVar18[uVar25].m_backend.data._M_elems + 4;
    local_4c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
    local_4c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
    local_4c8.m_backend.exp = pnVar18[uVar25].m_backend.exp;
    local_4c8.m_backend.neg = pnVar18[uVar25].m_backend.neg;
    local_4c8.m_backend.fpclass = pnVar18[uVar25].m_backend.fpclass;
    local_4c8.m_backend.prec_elem = pnVar18[uVar25].m_backend.prec_elem;
    feastol(&local_180,this);
    bVar11 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_488,&local_4c8,&local_180);
    if (bVar11) {
      fixColumn(this,lp,j_00,true);
      iVar5 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem
              [(lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[uVar25].idx].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused;
      removeCol(this,lp,j_00);
      iVar13 = iVar13 + 1;
      t = t + iVar5;
      piVar1 = (this->m_stat).data + 5;
      *piVar1 = *piVar1 + 1;
    }
  }
  RVar27 = DUAL_INFEASIBLE;
  goto LAB_002679f7;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::simplifyDual(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies LP using the following dual structures:
   //
   // 1. dominated columns
   // 2. weakly dominated columns
   //
   // For constructing the dual variables, it is assumed that the objective sense is max

   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   DataArray<bool> colSingleton(lp.nCols());
   VectorBase<R>         dualVarLo(lp.nRows());
   VectorBase<R>         dualVarUp(lp.nRows());
   VectorBase<R>         dualConsLo(lp.nCols());
   VectorBase<R>         dualConsUp(lp.nCols());

   // init
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // check for unconstrained constraints
      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         SPxOut::debug(this, "IMAISM43 row {}: unconstrained\n", i);

         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         remNzos += lp.rowVector(i).size();
         removeRow(lp, i);

         ++m_stat[FREE_ROW];

         continue;
      }

      // corresponds to maximization sense
      dualVarLo[i] = (lp.lhs(i) <= R(-infinity)) ? 0.0 : R(-infinity);
      dualVarUp[i] = (lp.rhs(i) >=  R(infinity)) ? 0.0 :  R(infinity);
   }

   // compute bounds on the dual variables using column singletons
   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(lp.colVector(j).size() == 1)
      {
         int  i   = lp.colVector(j).index(0);
         R aij = lp.colVector(j).value(0);

         SOPLEX_ASSERT_WARN("WMAISM44", isNotZero(aij, R(1.0 / R(infinity))));

         R bound = lp.maxObj(j) / aij;

         if(aij > 0)
         {
            if(lp.lower(j) <= R(-infinity) && bound < dualVarUp[i])
               dualVarUp[i] = bound;

            if(lp.upper(j) >=  R(infinity) && bound > dualVarLo[i])
               dualVarLo[i] = bound;
         }
         else if(aij < 0)
         {
            if(lp.lower(j) <= R(-infinity) && bound > dualVarLo[i])
               dualVarLo[i] = bound;

            if(lp.upper(j) >=  R(infinity) && bound < dualVarUp[i])
               dualVarUp[i] = bound;
         }
      }

   }

   // compute bounds on the dual constraints
   for(int j = 0; j < lp.nCols(); ++j)
   {
      dualConsLo[j] = dualConsUp[j] = 0.0;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         if(dualConsLo[j] <= R(-infinity) && dualConsUp[j] >= R(infinity))
            break;

         R aij = col.value(k);
         int  i   = col.index(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(aij > 0)
         {
            if(dualVarLo[i] <= R(-infinity))
               dualConsLo[j] = R(-infinity);
            else
               dualConsLo[j] += aij * dualVarLo[i];

            if(dualVarUp[i] >= R(infinity))
               dualConsUp[j] = R(infinity);
            else
               dualConsUp[j] += aij * dualVarUp[i];
         }
         else if(aij < 0)
         {
            if(dualVarLo[i] <= R(-infinity))
               dualConsUp[j] = R(infinity);
            else
               dualConsUp[j] += aij * dualVarLo[i];

            if(dualVarUp[i] >= R(infinity))
               dualConsLo[j] = R(-infinity);
            else
               dualConsLo[j] += aij * dualVarUp[i];
         }
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      if(lp.colVector(j).size() <= 1)
         continue;

      // dual infeasibility checks
      if(LTrel(dualConsUp[j], dualConsLo[j], opttol()))
      {
         SPxOut::debug(this, "IMAISM46 col {}: dual infeasible -> dual lhs bound={} dual rhs bound={}\n", j,
                       dualConsLo[j], dualConsUp[j]);
         return this->DUAL_INFEASIBLE;
      }

      R obj = lp.maxObj(j);

      // 1. dominated column
      // Is the problem really unbounded in the cases below ??? Or is only dual infeasibility be shown
      if(GTrel(obj, dualConsUp[j], opttol()))
      {
#if SOPLEX_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM47 col{}: dominated -> maxObj={} dual rhs bound={}\n", j, obj,
                       dualConsUp[j]);

         if(lp.upper(j) >= R(infinity))
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " unbounded" << std::endl;)
            return this->UNBOUNDED;
         }

         SPxOut::debug(this, " fixed at upper={}\n", lp.upper(j));

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.upper(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeLower(j, lp.upper(j));

         ++m_stat[DOMINATED_COL];
#endif
      }
      else if(LTrel(obj, dualConsLo[j], opttol()))
      {
#if SOPLEX_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM48 col {}: dominated -> maxObj={} dual lhs bound={}\n", j, obj,
                       dualConsLo[j]);

         if(lp.lower(j) <= R(-infinity))
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " unbounded" << std::endl;)
            return this->UNBOUNDED;
         }

         SPxOut::debug(this, " fixed at lower={}\n", lp.lower(j));

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.lower(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeUpper(j, lp.lower(j));

         ++m_stat[DOMINATED_COL];
#endif
      }

      // 2. weakly dominated column (no postsolving)
      else if(lp.upper(j) < R(infinity) && EQrel(obj, dualConsUp[j], opttol()))
      {
#if SOPLEX_WEAKLY_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM49 col {}: weakly dominated -> maxObj={} dual rhs bound={}\n", j, obj,
                       dualConsUp[j]);

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.upper(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeLower(j, lp.upper(j));

         ++m_stat[WEAKLY_DOMINATED_COL];
#endif
      }
      else if(lp.lower(j) > R(-infinity) && EQrel(obj, dualConsLo[j], opttol()))
      {
#if SOPLEX_WEAKLY_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM50 col {}: weakly dominated -> maxObj={} dual lhs bound={}\n", j, obj,
                       dualConsLo[j]);

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.lower(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeUpper(j, lp.lower(j));

         ++m_stat[WEAKLY_DOMINATED_COL];
#endif
      }

      // fix column
      if(EQrel(lp.lower(j), lp.upper(j), feastol()))
      {
#if SOPLEX_FIX_VARIABLE
         fixColumn(lp, j);

         ++remCols;
         remNzos += lp.colVector(j).size();
         removeCol(lp, j);

         ++m_stat[FIX_COL];
#endif
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (dual) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}